

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

Message * __thiscall testing::Message::operator<<(Message *this,wstring *wstr)

{
  long lVar1;
  long lVar2;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  long lVar4;
  void *pvVar5;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  long lVar7;
  char local_49;
  internal local_48;
  undefined7 uStack_47;
  long local_40;
  Message *local_38;
  
  lVar1 = *(long *)(wstr + 8);
  if (lVar1 != 0) {
    lVar2 = *(long *)wstr;
    lVar4 = 0;
    local_38 = this;
    do {
      if (*(int *)(lVar2 + lVar4 * 4) == 0) {
        pbVar3 = (this->ss_).ptr_;
        pbVar6 = pbVar3 + 0x10;
        if (pbVar3 == (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
           ) {
          pbVar6 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
        local_48 = (internal)0x0;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)pbVar6,(char *)&local_48,1);
        lVar4 = lVar4 + 1;
      }
      else {
        internal::WideStringToUtf8(&local_48,(wchar_t *)(lVar2 + lVar4 * 4),(int)lVar1 - (int)lVar4)
        ;
        pbVar3 = (this->ss_).ptr_;
        pbVar6 = pbVar3 + 0x10;
        if (pbVar3 == (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
           ) {
          pbVar6 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
        pvVar5 = (void *)CONCAT71(uStack_47,local_48);
        if (pvVar5 == (void *)0x0) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)pbVar6,"(null)",6);
LAB_00177edf:
          pvVar5 = (void *)CONCAT71(uStack_47,local_48);
          this = local_38;
          if (pvVar5 != (void *)0x0) goto LAB_00177eee;
        }
        else {
          if (local_40 != 0) {
            lVar7 = 0;
            do {
              if (*(char *)((long)pvVar5 + lVar7) == '\0') {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)pbVar6,"\\0",2);
              }
              else {
                local_49 = *(char *)((long)pvVar5 + lVar7);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)pbVar6,&local_49,1);
              }
              lVar7 = lVar7 + 1;
            } while (lVar7 != local_40);
            goto LAB_00177edf;
          }
LAB_00177eee:
          operator_delete__(pvVar5);
        }
        while( true ) {
          if (lVar1 == lVar4) {
            return this;
          }
          if (*(int *)(lVar2 + lVar4 * 4) == 0) break;
          lVar4 = lVar4 + 1;
        }
      }
    } while (lVar4 != lVar1);
  }
  return this;
}

Assistant:

Message& Message::operator <<(const ::std::wstring& wstr) {
  internal::StreamWideCharsToMessage(wstr.c_str(), wstr.length(), this);
  return *this;
}